

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O3

void convolve_2d_sr_hor_4tap_ssse3
               (uint8_t *src,int32_t src_stride,int32_t w,int32_t h,
               InterpFilterParams *filter_params_x,int32_t subpel_x_q4,int16_t *im_block)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  undefined1 (*pauVar5) [16];
  undefined1 (*pauVar6) [32];
  undefined1 auVar7 [32];
  __m128i coeffs_1;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  
  auVar24 = _DAT_00528e90;
  auVar19 = _DAT_00528e80;
  pauVar5 = (undefined1 (*) [16])(src + -1);
  auVar8 = vpsraw_avx(*(undefined1 (*) [16])
                       (filter_params_x->filter_ptr +
                       (subpel_x_q4 & 0xfU) * (uint)filter_params_x->taps),1);
  if (w < 5) {
    auVar1 = vpshufb_avx(auVar8,_DAT_004dd2e0);
    auVar8 = vpshufb_avx(auVar8,_DAT_004dd2b0);
    if (w == 2) {
      lVar4 = 0;
      auVar19._8_2_ = 2;
      auVar19._0_8_ = 0x2000200020002;
      auVar19._10_2_ = 2;
      auVar19._12_2_ = 2;
      auVar19._14_2_ = 2;
      do {
        auVar24._8_8_ = 0;
        auVar24._0_8_ = *(ulong *)*pauVar5;
        auVar24 = vmovhps_avx(auVar24,*(undefined8 *)(*pauVar5 + src_stride));
        auVar18 = vpshufb_avx(auVar24,ZEXT816(0xa09090802010100));
        auVar23 = vpshufb_avx(auVar24,ZEXT816(0xc0b0b0a04030302));
        auVar24 = vpmaddubsw_avx(auVar18,auVar1);
        auVar18 = vpmaddubsw_avx(auVar23,auVar8);
        auVar24 = vpaddw_avx(auVar24,auVar18);
        auVar24 = vpaddw_avx(auVar24,auVar19);
        auVar24 = vpsraw_avx(auVar24,2);
        *(long *)(im_block + lVar4 * 2) = auVar24._0_8_;
        pauVar5 = (undefined1 (*) [16])(*pauVar5 + src_stride * 2);
        lVar4 = lVar4 + 2;
      } while (h != (int)lVar4);
    }
    else if (w == 4) {
      lVar4 = 0;
      auVar18._8_2_ = 2;
      auVar18._0_8_ = 0x2000200020002;
      auVar18._10_2_ = 2;
      auVar18._12_2_ = 2;
      auVar18._14_2_ = 2;
      do {
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(ulong *)*pauVar5;
        auVar23 = vmovhps_avx(auVar23,*(undefined8 *)(*pauVar5 + src_stride));
        auVar2 = vpshufb_avx(auVar23,auVar19);
        auVar3 = vpshufb_avx(auVar23,auVar24);
        auVar23 = vpmaddubsw_avx(auVar2,auVar1);
        auVar2 = vpmaddubsw_avx(auVar3,auVar8);
        auVar23 = vpaddw_avx(auVar23,auVar2);
        auVar23 = vpaddw_avx(auVar23,auVar18);
        auVar23 = vpsraw_avx(auVar23,2);
        *(undefined1 (*) [16])(im_block + lVar4 * 4) = auVar23;
        pauVar5 = (undefined1 (*) [16])(*pauVar5 + src_stride * 2);
        lVar4 = lVar4 + 2;
      } while (h != (int)lVar4);
    }
  }
  else {
    auVar19 = vpshufb_avx(auVar8,_DAT_00528e60);
    auVar7._0_2_ = auVar19._0_2_;
    auVar7._2_2_ = auVar7._0_2_;
    auVar7._4_2_ = auVar7._0_2_;
    auVar7._6_2_ = auVar7._0_2_;
    auVar7._8_2_ = auVar7._0_2_;
    auVar7._10_2_ = auVar7._0_2_;
    auVar7._12_2_ = auVar7._0_2_;
    auVar7._14_2_ = auVar7._0_2_;
    auVar7._16_2_ = auVar7._0_2_;
    auVar7._18_2_ = auVar7._0_2_;
    auVar7._20_2_ = auVar7._0_2_;
    auVar7._22_2_ = auVar7._0_2_;
    auVar7._24_2_ = auVar7._0_2_;
    auVar7._26_2_ = auVar7._0_2_;
    auVar7._28_2_ = auVar7._0_2_;
    auVar7._30_2_ = auVar7._0_2_;
    auVar19 = vpshufb_avx(auVar8,_DAT_00528e70);
    auVar9._0_2_ = auVar19._0_2_;
    auVar9._2_2_ = auVar9._0_2_;
    auVar9._4_2_ = auVar9._0_2_;
    auVar9._6_2_ = auVar9._0_2_;
    auVar9._8_2_ = auVar9._0_2_;
    auVar9._10_2_ = auVar9._0_2_;
    auVar9._12_2_ = auVar9._0_2_;
    auVar9._14_2_ = auVar9._0_2_;
    auVar9._16_2_ = auVar9._0_2_;
    auVar9._18_2_ = auVar9._0_2_;
    auVar9._20_2_ = auVar9._0_2_;
    auVar9._22_2_ = auVar9._0_2_;
    auVar9._24_2_ = auVar9._0_2_;
    auVar9._26_2_ = auVar9._0_2_;
    auVar9._28_2_ = auVar9._0_2_;
    auVar9._30_2_ = auVar9._0_2_;
    switch(w << 0x1d | w - 8U >> 3) {
    case 0:
      auVar10._16_16_ = _DAT_004dd740;
      auVar10._0_16_ = _DAT_004dd740;
      auVar13._16_16_ = _DAT_004dd310;
      auVar13._0_16_ = _DAT_004dd310;
      auVar20._8_2_ = 2;
      auVar20._0_8_ = 0x2000200020002;
      auVar20._10_2_ = 2;
      auVar20._12_2_ = 2;
      auVar20._14_2_ = 2;
      auVar20._16_2_ = 2;
      auVar20._18_2_ = 2;
      auVar20._20_2_ = 2;
      auVar20._22_2_ = 2;
      auVar20._24_2_ = 2;
      auVar20._26_2_ = 2;
      auVar20._28_2_ = 2;
      auVar20._30_2_ = 2;
      do {
        auVar25._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(*pauVar5 + src_stride) + ZEXT116(1) * *pauVar5;
        auVar25._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(*pauVar5 + src_stride);
        auVar31 = vpshufb_avx2(auVar25,auVar10);
        auVar16 = vpshufb_avx2(auVar25,auVar13);
        auVar31 = vpmaddubsw_avx2(auVar31,auVar7);
        auVar16 = vpmaddubsw_avx2(auVar16,auVar9);
        auVar31 = vpaddw_avx2(auVar31,auVar16);
        auVar31 = vpaddw_avx2(auVar31,auVar20);
        auVar31 = vpsraw_avx2(auVar31,2);
        *(undefined1 (*) [32])im_block = auVar31;
        pauVar5 = (undefined1 (*) [16])(*pauVar5 + src_stride * 2);
        im_block = (int16_t *)((long)im_block + 0x20);
        h = h + -2;
      } while (h != 0);
      break;
    case 1:
      pauVar5 = (undefined1 (*) [16])(src + 7);
      auVar11._16_16_ = _DAT_004dd740;
      auVar11._0_16_ = _DAT_004dd740;
      auVar15._16_16_ = _DAT_004dd310;
      auVar15._0_16_ = _DAT_004dd310;
      auVar21._8_2_ = 2;
      auVar21._0_8_ = 0x2000200020002;
      auVar21._10_2_ = 2;
      auVar21._12_2_ = 2;
      auVar21._14_2_ = 2;
      auVar21._16_2_ = 2;
      auVar21._18_2_ = 2;
      auVar21._20_2_ = 2;
      auVar21._22_2_ = 2;
      auVar21._24_2_ = 2;
      auVar21._26_2_ = 2;
      auVar21._28_2_ = 2;
      auVar21._30_2_ = 2;
      do {
        auVar26._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(pauVar5[-1] + (long)src_stride + 8) +
             ZEXT116(1) * *(undefined1 (*) [16])(pauVar5[-1] + 8);
        auVar26._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(pauVar5[-1] + (long)src_stride + 8);
        auVar31 = vpshufb_avx2(auVar26,auVar11);
        auVar16 = vpshufb_avx2(auVar26,auVar15);
        auVar31 = vpmaddubsw_avx2(auVar31,auVar7);
        auVar16 = vpmaddubsw_avx2(auVar16,auVar9);
        auVar31 = vpaddw_avx2(auVar31,auVar16);
        auVar29._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(*pauVar5 + src_stride) + ZEXT116(1) * *pauVar5;
        auVar29._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(*pauVar5 + src_stride);
        auVar16 = vpshufb_avx2(auVar29,auVar11);
        auVar28 = vpshufb_avx2(auVar29,auVar15);
        auVar16 = vpmaddubsw_avx2(auVar16,auVar7);
        auVar28 = vpmaddubsw_avx2(auVar28,auVar9);
        auVar16 = vpaddw_avx2(auVar16,auVar28);
        auVar31 = vpaddw_avx2(auVar31,auVar21);
        auVar16 = vpaddw_avx2(auVar16,auVar21);
        auVar32._0_16_ = ZEXT116(0) * auVar16._0_16_ + ZEXT116(1) * auVar31._0_16_;
        auVar32._16_16_ = ZEXT116(0) * auVar31._16_16_ + ZEXT116(1) * auVar16._0_16_;
        auVar28 = vpsraw_avx2(auVar32,2);
        auVar31 = vperm2i128_avx2(auVar31,auVar16,0x31);
        auVar31 = vpsraw_avx2(auVar31,2);
        *(undefined1 (*) [32])im_block = auVar28;
        *(undefined1 (*) [32])((long)im_block + 0x20) = auVar31;
        im_block = (int16_t *)((long)im_block + 0x40);
        pauVar5 = (undefined1 (*) [16])(*pauVar5 + src_stride * 2);
        h = h + -2;
      } while (h != 0);
      break;
    default:
      pauVar6 = (undefined1 (*) [32])(src + 0x67);
      auVar12._16_16_ = _DAT_004dd740;
      auVar12._0_16_ = _DAT_004dd740;
      auVar17._16_16_ = _DAT_004dd310;
      auVar17._0_16_ = _DAT_004dd310;
      auVar22._8_2_ = 2;
      auVar22._0_8_ = 0x2000200020002;
      auVar22._10_2_ = 2;
      auVar22._12_2_ = 2;
      auVar22._14_2_ = 2;
      auVar22._16_2_ = 2;
      auVar22._18_2_ = 2;
      auVar22._20_2_ = 2;
      auVar22._22_2_ = 2;
      auVar22._24_2_ = 2;
      auVar22._26_2_ = 2;
      auVar22._28_2_ = 2;
      auVar22._30_2_ = 2;
      do {
        auVar31 = vpshufb_avx2(*(undefined1 (*) [32])(pauVar6[-4] + 0x18),auVar12);
        auVar16 = vpshufb_avx2(*(undefined1 (*) [32])(pauVar6[-4] + 0x18),auVar17);
        auVar31 = vpmaddubsw_avx2(auVar31,auVar7);
        auVar16 = vpmaddubsw_avx2(auVar16,auVar9);
        auVar31 = vpaddw_avx2(auVar31,auVar16);
        auVar16 = vpshufb_avx2(pauVar6[-3],auVar12);
        auVar28 = vpshufb_avx2(pauVar6[-3],auVar17);
        auVar16 = vpmaddubsw_avx2(auVar16,auVar7);
        auVar28 = vpmaddubsw_avx2(auVar28,auVar9);
        auVar16 = vpaddw_avx2(auVar16,auVar28);
        auVar31 = vpaddw_avx2(auVar31,auVar22);
        auVar28 = vpsraw_avx2(auVar31,2);
        auVar31 = vpaddw_avx2(auVar16,auVar22);
        auVar31 = vpsraw_avx2(auVar31,2);
        *(undefined1 (*) [32])im_block = auVar28;
        *(undefined1 (*) [32])((long)im_block + 0x20) = auVar31;
        auVar31 = vpshufb_avx2(*(undefined1 (*) [32])(pauVar6[-3] + 0x18),auVar12);
        auVar16 = vpshufb_avx2(*(undefined1 (*) [32])(pauVar6[-3] + 0x18),auVar17);
        auVar31 = vpmaddubsw_avx2(auVar31,auVar7);
        auVar16 = vpmaddubsw_avx2(auVar16,auVar9);
        auVar31 = vpaddw_avx2(auVar31,auVar16);
        auVar16 = vpshufb_avx2(pauVar6[-2],auVar12);
        auVar28 = vpshufb_avx2(pauVar6[-2],auVar17);
        auVar16 = vpmaddubsw_avx2(auVar16,auVar7);
        auVar28 = vpmaddubsw_avx2(auVar28,auVar9);
        auVar16 = vpaddw_avx2(auVar16,auVar28);
        auVar31 = vpaddw_avx2(auVar31,auVar22);
        auVar28 = vpsraw_avx2(auVar31,2);
        auVar31 = vpaddw_avx2(auVar16,auVar22);
        auVar31 = vpsraw_avx2(auVar31,2);
        *(undefined1 (*) [32])((long)im_block + 0x40) = auVar28;
        *(undefined1 (*) [32])((long)im_block + 0x60) = auVar31;
        auVar31 = vpshufb_avx2(*(undefined1 (*) [32])(pauVar6[-2] + 0x18),auVar12);
        auVar16 = vpshufb_avx2(*(undefined1 (*) [32])(pauVar6[-2] + 0x18),auVar17);
        auVar31 = vpmaddubsw_avx2(auVar31,auVar7);
        auVar16 = vpmaddubsw_avx2(auVar16,auVar9);
        auVar31 = vpaddw_avx2(auVar31,auVar16);
        auVar16 = vpshufb_avx2(pauVar6[-1],auVar12);
        auVar28 = vpshufb_avx2(pauVar6[-1],auVar17);
        auVar16 = vpmaddubsw_avx2(auVar16,auVar7);
        auVar28 = vpmaddubsw_avx2(auVar28,auVar9);
        auVar16 = vpaddw_avx2(auVar16,auVar28);
        auVar31 = vpaddw_avx2(auVar31,auVar22);
        auVar28 = vpsraw_avx2(auVar31,2);
        auVar31 = vpaddw_avx2(auVar16,auVar22);
        auVar31 = vpsraw_avx2(auVar31,2);
        *(undefined1 (*) [32])((long)im_block + 0x80) = auVar28;
        *(undefined1 (*) [32])((long)im_block + 0xa0) = auVar31;
        auVar31 = vpshufb_avx2(*(undefined1 (*) [32])(pauVar6[-1] + 0x18),auVar12);
        auVar16 = vpshufb_avx2(*(undefined1 (*) [32])(pauVar6[-1] + 0x18),auVar17);
        auVar31 = vpmaddubsw_avx2(auVar31,auVar7);
        auVar16 = vpmaddubsw_avx2(auVar16,auVar9);
        auVar31 = vpaddw_avx2(auVar31,auVar16);
        auVar16 = vpshufb_avx2(*pauVar6,auVar12);
        auVar28 = vpshufb_avx2(*pauVar6,auVar17);
        auVar16 = vpmaddubsw_avx2(auVar16,auVar7);
        auVar28 = vpmaddubsw_avx2(auVar28,auVar9);
        auVar16 = vpaddw_avx2(auVar16,auVar28);
        auVar31 = vpaddw_avx2(auVar31,auVar22);
        auVar28 = vpsraw_avx2(auVar31,2);
        auVar31 = vpaddw_avx2(auVar16,auVar22);
        auVar31 = vpsraw_avx2(auVar31,2);
        *(undefined1 (*) [32])((long)im_block + 0xc0) = auVar28;
        *(undefined1 (*) [32])((long)im_block + 0xe0) = auVar31;
        im_block = (int16_t *)((long)im_block + 0x100);
        pauVar6 = (undefined1 (*) [32])(*pauVar6 + src_stride);
        h = h + -1;
      } while (h != 0);
      break;
    case 3:
      pauVar6 = (undefined1 (*) [32])(src + 7);
      auVar30._16_16_ = _DAT_004dd740;
      auVar30._0_16_ = _DAT_004dd740;
      auVar14._16_16_ = _DAT_004dd310;
      auVar14._0_16_ = _DAT_004dd310;
      auVar27._8_2_ = 2;
      auVar27._0_8_ = 0x2000200020002;
      auVar27._10_2_ = 2;
      auVar27._12_2_ = 2;
      auVar27._14_2_ = 2;
      auVar27._16_2_ = 2;
      auVar27._18_2_ = 2;
      auVar27._20_2_ = 2;
      auVar27._22_2_ = 2;
      auVar27._24_2_ = 2;
      auVar27._26_2_ = 2;
      auVar27._28_2_ = 2;
      auVar27._30_2_ = 2;
      do {
        auVar31 = vpshufb_avx2(*(undefined1 (*) [32])(pauVar6[-1] + 0x18),auVar30);
        auVar16 = vpshufb_avx2(*(undefined1 (*) [32])(pauVar6[-1] + 0x18),auVar14);
        auVar31 = vpmaddubsw_avx2(auVar31,auVar7);
        auVar16 = vpmaddubsw_avx2(auVar16,auVar9);
        auVar31 = vpaddw_avx2(auVar31,auVar16);
        auVar16 = vpshufb_avx2(*pauVar6,auVar30);
        auVar28 = vpshufb_avx2(*pauVar6,auVar14);
        auVar16 = vpmaddubsw_avx2(auVar16,auVar7);
        auVar28 = vpmaddubsw_avx2(auVar28,auVar9);
        auVar16 = vpaddw_avx2(auVar16,auVar28);
        auVar31 = vpaddw_avx2(auVar31,auVar27);
        auVar28 = vpsraw_avx2(auVar31,2);
        auVar31 = vpaddw_avx2(auVar16,auVar27);
        auVar31 = vpsraw_avx2(auVar31,2);
        *(undefined1 (*) [32])im_block = auVar28;
        *(undefined1 (*) [32])((long)im_block + 0x20) = auVar31;
        im_block = (int16_t *)((long)im_block + 0x40);
        pauVar6 = (undefined1 (*) [32])(*pauVar6 + src_stride);
        h = h + -1;
      } while (h != 0);
      break;
    case 7:
      pauVar6 = (undefined1 (*) [32])(src + 0x27);
      auVar31._16_16_ = _DAT_004dd740;
      auVar31._0_16_ = _DAT_004dd740;
      auVar16._16_16_ = _DAT_004dd310;
      auVar16._0_16_ = _DAT_004dd310;
      auVar28._8_2_ = 2;
      auVar28._0_8_ = 0x2000200020002;
      auVar28._10_2_ = 2;
      auVar28._12_2_ = 2;
      auVar28._14_2_ = 2;
      auVar28._16_2_ = 2;
      auVar28._18_2_ = 2;
      auVar28._20_2_ = 2;
      auVar28._22_2_ = 2;
      auVar28._24_2_ = 2;
      auVar28._26_2_ = 2;
      auVar28._28_2_ = 2;
      auVar28._30_2_ = 2;
      do {
        auVar30 = vpshufb_avx2(*(undefined1 (*) [32])(pauVar6[-2] + 0x18),auVar31);
        auVar14 = vpshufb_avx2(*(undefined1 (*) [32])(pauVar6[-2] + 0x18),auVar16);
        auVar30 = vpmaddubsw_avx2(auVar30,auVar7);
        auVar14 = vpmaddubsw_avx2(auVar14,auVar9);
        auVar30 = vpaddw_avx2(auVar30,auVar14);
        auVar14 = vpshufb_avx2(pauVar6[-1],auVar31);
        auVar27 = vpshufb_avx2(pauVar6[-1],auVar16);
        auVar14 = vpmaddubsw_avx2(auVar14,auVar7);
        auVar27 = vpmaddubsw_avx2(auVar27,auVar9);
        auVar14 = vpaddw_avx2(auVar14,auVar27);
        auVar30 = vpaddw_avx2(auVar30,auVar28);
        auVar27 = vpsraw_avx2(auVar30,2);
        auVar30 = vpaddw_avx2(auVar14,auVar28);
        auVar30 = vpsraw_avx2(auVar30,2);
        *(undefined1 (*) [32])im_block = auVar27;
        *(undefined1 (*) [32])((long)im_block + 0x20) = auVar30;
        auVar30 = vpshufb_avx2(*(undefined1 (*) [32])(pauVar6[-1] + 0x18),auVar31);
        auVar14 = vpshufb_avx2(*(undefined1 (*) [32])(pauVar6[-1] + 0x18),auVar16);
        auVar30 = vpmaddubsw_avx2(auVar30,auVar7);
        auVar14 = vpmaddubsw_avx2(auVar14,auVar9);
        auVar30 = vpaddw_avx2(auVar30,auVar14);
        auVar14 = vpshufb_avx2(*pauVar6,auVar31);
        auVar27 = vpshufb_avx2(*pauVar6,auVar16);
        auVar14 = vpmaddubsw_avx2(auVar14,auVar7);
        auVar27 = vpmaddubsw_avx2(auVar27,auVar9);
        auVar14 = vpaddw_avx2(auVar14,auVar27);
        auVar30 = vpaddw_avx2(auVar30,auVar28);
        auVar27 = vpsraw_avx2(auVar30,2);
        auVar30 = vpaddw_avx2(auVar14,auVar28);
        auVar30 = vpsraw_avx2(auVar30,2);
        *(undefined1 (*) [32])((long)im_block + 0x40) = auVar27;
        *(undefined1 (*) [32])((long)im_block + 0x60) = auVar30;
        im_block = (int16_t *)((long)im_block + 0x80);
        pauVar6 = (undefined1 (*) [32])(*pauVar6 + src_stride);
        h = h + -1;
      } while (h != 0);
    }
  }
  return;
}

Assistant:

static void convolve_2d_sr_hor_4tap_ssse3(
    const uint8_t *const src, const int32_t src_stride, const int32_t w,
    const int32_t h, const InterpFilterParams *const filter_params_x,
    const int32_t subpel_x_q4, int16_t *const im_block) {
  const uint8_t *src_ptr = src - 1;
  int32_t y = h;
  int16_t *im = im_block;

  if (w <= 4) {
    __m128i coeffs_128[2];

    prepare_half_coeffs_4tap_ssse3(filter_params_x, subpel_x_q4, coeffs_128);
    if (w == 2) {
      do {
        const __m128i r =
            x_convolve_4tap_2x2_ssse3(src_ptr, src_stride, coeffs_128);
        xy_x_round_store_2x2_sse2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 2;
        y -= 2;
      } while (y);
    } else if (w == 4) {
      do {
        const __m128i r =
            x_convolve_4tap_4x2_ssse3(src_ptr, src_stride, coeffs_128);
        xy_x_round_store_4x2_sse2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 4;
        y -= 2;
      } while (y);
    }
  } else {
    // TODO(chiyotsai@google.com): Add better optimization
    __m256i coeffs_256[2], filt_256[2];

    prepare_half_coeffs_4tap_avx2(filter_params_x, subpel_x_q4, coeffs_256);
    filt_256[0] = _mm256_load_si256((__m256i const *)filt1_global_avx2);
    filt_256[1] = _mm256_load_si256((__m256i const *)filt2_global_avx2);

    if (w == 8) {
      do {
        __m256i res =
            x_convolve_4tap_8x2_avx2(src_ptr, src_stride, coeffs_256, filt_256);
        xy_x_round_store_8x2_avx2(res, im);

        src_ptr += 2 * src_stride;
        im += 2 * 8;
        y -= 2;
      } while (y);
    } else if (w == 16) {
      do {
        __m256i r[2];

        x_convolve_4tap_16x2_avx2(src_ptr, src_stride, coeffs_256, filt_256, r);
        xy_x_round_store_32_avx2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 16;
        y -= 2;
      } while (y);
    } else if (w == 32) {
      do {
        xy_x_4tap_32_avx2(src_ptr, coeffs_256, filt_256, im);

        src_ptr += src_stride;
        im += 32;
      } while (--y);
    } else if (w == 64) {
      do {
        xy_x_4tap_32_avx2(src_ptr, coeffs_256, filt_256, im);
        xy_x_4tap_32_avx2(src_ptr + 32, coeffs_256, filt_256, im + 32);
        src_ptr += src_stride;
        im += 64;
      } while (--y);
    } else {
      assert(w == 128);

      do {
        xy_x_4tap_32_avx2(src_ptr, coeffs_256, filt_256, im);
        xy_x_4tap_32_avx2(src_ptr + 32, coeffs_256, filt_256, im + 32);
        xy_x_4tap_32_avx2(src_ptr + 64, coeffs_256, filt_256, im + 64);
        xy_x_4tap_32_avx2(src_ptr + 96, coeffs_256, filt_256, im + 96);
        src_ptr += src_stride;
        im += 128;
      } while (--y);
    }
  }
}